

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O0

void ggml_vec_dot_q4_1_q8_1(int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m256 x_00;
  __m256i sy;
  __m256i ax;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  long in_RCX;
  float *in_RSI;
  int in_EDI;
  long in_R9;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  uint8_t *puVar15;
  float fVar17;
  longlong lVar16;
  float fVar18;
  undefined4 uVar20;
  undefined8 uVar19;
  undefined1 auVar14 [64];
  int sumi;
  int v1;
  int v0;
  int j;
  int sumi1;
  int sumi0;
  __m256 xy;
  __m256i qy;
  __m256i qx;
  __m256 d0d1;
  __m256 d1v;
  __m256 d0v;
  float d1;
  float d0;
  float summs;
  __m256 acc;
  float sumf;
  int ib;
  block_q8_1 *y;
  block_q4_1 *x;
  int nb;
  int qk;
  undefined4 in_stack_fffffffffffffcd8;
  float in_stack_fffffffffffffcdc;
  float in_stack_fffffffffffffce0;
  float in_stack_fffffffffffffce4;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  undefined4 in_stack_fffffffffffffcf0;
  float in_stack_fffffffffffffcf4;
  int iVar21;
  undefined4 in_stack_fffffffffffffcf8;
  int iVar22;
  undefined4 in_stack_fffffffffffffcfc;
  int iVar23;
  undefined8 in_stack_fffffffffffffd00;
  uint8_t *in_stack_fffffffffffffd08;
  longlong in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined4 local_224;
  undefined1 local_220 [16];
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined1 extraout_var [60];
  
  if (in_EDI < 0) {
    in_EDI = in_EDI + 0x1f;
  }
  local_220 = ZEXT816(0);
  local_224 = 0.0;
  for (local_1f4 = 0; local_1f4 < in_EDI >> 5; local_1f4 = local_1f4 + 1) {
    in_stack_fffffffffffffce0 =
         ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RCX + (long)local_1f4 * 0x14));
    in_stack_fffffffffffffce4 =
         ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_R9 + (long)local_1f4 * 0x24));
    in_stack_fffffffffffffcdc =
         ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RCX + 2 + (long)local_1f4 * 0x14));
    auVar14._0_4_ = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_R9 + 2 + (long)local_1f4 * 0x24));
    auVar14._4_60_ = extraout_var;
    auVar4 = vfmadd213ss_fma(auVar14._0_16_,ZEXT416((uint)in_stack_fffffffffffffcdc),
                             ZEXT416((uint)local_224));
    local_224 = auVar4._0_4_;
    auVar4 = vinsertps_avx(ZEXT416((uint)in_stack_fffffffffffffce0),
                           ZEXT416((uint)in_stack_fffffffffffffce0),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)in_stack_fffffffffffffce0),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)in_stack_fffffffffffffce0),0x30);
    auVar1 = vinsertps_avx(ZEXT416((uint)in_stack_fffffffffffffce0),
                           ZEXT416((uint)in_stack_fffffffffffffce0),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)in_stack_fffffffffffffce0),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)in_stack_fffffffffffffce0),0x30);
    auVar2 = vinsertps_avx(ZEXT416((uint)in_stack_fffffffffffffce4),
                           ZEXT416((uint)in_stack_fffffffffffffce4),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)in_stack_fffffffffffffce4),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)in_stack_fffffffffffffce4),0x30);
    auVar3 = vinsertps_avx(ZEXT416((uint)in_stack_fffffffffffffce4),
                           ZEXT416((uint)in_stack_fffffffffffffce4),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)in_stack_fffffffffffffce4),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)in_stack_fffffffffffffce4),0x30);
    local_180 = auVar4._0_4_;
    uStack_17c = auVar4._4_4_;
    uStack_178 = auVar4._8_4_;
    uStack_174 = auVar4._12_4_;
    uStack_170 = auVar1._0_4_;
    uStack_16c = auVar1._4_4_;
    uStack_168 = auVar1._8_4_;
    uStack_164 = auVar1._12_4_;
    local_1a0 = auVar3._0_4_;
    uStack_19c = auVar3._4_4_;
    uStack_198 = auVar3._8_4_;
    uStack_194 = auVar3._12_4_;
    uStack_190 = auVar2._0_4_;
    uStack_18c = auVar2._4_4_;
    uStack_188 = auVar2._8_4_;
    fVar8 = local_180 * local_1a0;
    fVar9 = uStack_17c * uStack_19c;
    fVar10 = uStack_178 * uStack_198;
    fVar11 = uStack_174 * uStack_194;
    fVar12 = uStack_170 * uStack_190;
    fVar17 = uStack_16c * uStack_18c;
    fVar18 = uStack_168 * uStack_188;
    uVar20 = uStack_164;
    bytes_from_nibbles_32(in_stack_fffffffffffffd08);
    lVar7 = in_R9 + (long)local_1f4 * 0x24;
    uVar13 = CONCAT44(fVar9,fVar8);
    puVar15 = (uint8_t *)CONCAT44(fVar11,fVar10);
    lVar16 = CONCAT44(fVar17,fVar12);
    uVar19 = CONCAT44(uVar20,fVar18);
    ax[1] = *(undefined8 *)(lVar7 + 4);
    ax[0] = in_stack_fffffffffffffd18;
    ax[2] = *(undefined8 *)(lVar7 + 0xc);
    ax[3] = *(longlong *)(lVar7 + 0x14);
    sy[0]._4_4_ = in_stack_fffffffffffffcfc;
    sy[0]._0_4_ = in_stack_fffffffffffffcf8;
    sy[1] = in_stack_fffffffffffffd00;
    sy[2] = (longlong)in_stack_fffffffffffffd08;
    sy[3] = in_stack_fffffffffffffd10;
    mul_sum_us8_pairs_float(ax,sy);
    auVar6._4_4_ = uStack_17c * uStack_19c;
    auVar6._0_4_ = local_180 * local_1a0;
    auVar6._12_4_ = uStack_174 * uStack_194;
    auVar6._8_4_ = uStack_178 * uStack_198;
    auVar6._20_4_ = uStack_16c * uStack_18c;
    auVar6._16_4_ = uStack_170 * uStack_190;
    auVar6._28_4_ = uStack_164;
    auVar6._24_4_ = uStack_168 * uStack_188;
    auVar5._8_8_ = puVar15;
    auVar5._0_8_ = uVar13;
    auVar5._16_8_ = lVar16;
    auVar5._24_8_ = uVar19;
    local_220 = vfmadd213ps_fma(auVar5,auVar6,ZEXT1632(local_220));
    in_stack_fffffffffffffd00 = uVar13;
    in_stack_fffffffffffffd08 = puVar15;
    in_stack_fffffffffffffd10 = lVar16;
    in_stack_fffffffffffffd18 = uVar19;
  }
  x_00[1] = in_stack_fffffffffffffcdc;
  x_00[0] = (float)in_stack_fffffffffffffcd8;
  x_00[2] = in_stack_fffffffffffffce0;
  x_00[3] = in_stack_fffffffffffffce4;
  x_00[4] = (float)in_stack_fffffffffffffce8;
  x_00[5] = (float)in_stack_fffffffffffffcec;
  x_00[6] = (float)in_stack_fffffffffffffcf0;
  x_00[7] = in_stack_fffffffffffffcf4;
  local_1f8 = hsum_float_8(x_00);
  local_1f8 = local_1f8 + local_224;
  for (; local_1f4 < in_EDI >> 5; local_1f4 = local_1f4 + 1) {
    iVar23 = 0;
    iVar22 = 0;
    for (iVar21 = 0; iVar21 < 0x10; iVar21 = iVar21 + 1) {
      iVar23 = (*(byte *)(in_RCX + (long)local_1f4 * 0x14 + 4 + (long)iVar21) & 0xf) *
               (int)*(char *)(in_R9 + (long)local_1f4 * 0x24 + 4 + (long)iVar21) + iVar23;
      iVar22 = ((int)(uint)*(byte *)(in_RCX + (long)local_1f4 * 0x14 + 4 + (long)iVar21) >> 4) *
               (int)*(char *)(in_R9 + (long)local_1f4 * 0x24 + 4 + (long)(iVar21 + 0x10)) + iVar22;
    }
    iVar23 = iVar23 + iVar22;
    fVar8 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RCX + (long)local_1f4 * 0x14));
    fVar9 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_R9 + (long)local_1f4 * 0x24));
    fVar10 = (float)iVar23;
    fVar11 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RCX + (long)local_1f4 * 0x14 + 2));
    fVar12 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_R9 + (long)local_1f4 * 0x24 + 2));
    auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)(fVar8 * fVar9)),
                             ZEXT416((uint)(fVar11 * fVar12)));
    local_1f8 = auVar4._0_4_ + local_1f8;
  }
  *in_RSI = local_1f8;
  return;
}

Assistant:

void ggml_vec_dot_q4_1_q8_1(int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    const int qk = QK8_1;
    const int nb = n / qk;

    assert(n % qk == 0);
#if defined(__ARM_FEATURE_MATMUL_INT8)
    assert((nrc == 2) || (nrc == 1));
#else
    assert(nrc == 1);
#endif
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const block_q4_1 * GGML_RESTRICT x = vx;
    const block_q8_1 * GGML_RESTRICT y = vy;

#if defined(__ARM_FEATURE_MATMUL_INT8)
    if (nrc == 2) {
        const block_q4_1 * GGML_RESTRICT vx0 = vx;
        const block_q4_1 * GGML_RESTRICT vx1 = (const block_q4_1 *) ((const uint8_t*)vx + bx);
        const block_q8_1 * GGML_RESTRICT vy0 = vy;
        const block_q8_1 * GGML_RESTRICT vy1 = (const block_q8_1 *) ((const uint8_t*)vy + by);

        float32x4_t sumv0 = vdupq_n_f32(0.0f);
        float32x4_t summs0 = vdupq_n_f32(0.0f);

        for (int i = 0; i < nb; i++) {
            const block_q4_1 * GGML_RESTRICT b_x0 = &vx0[i];
            const block_q4_1 * GGML_RESTRICT b_x1 = &vx1[i];
            const block_q8_1 * GGML_RESTRICT b_y0 = &vy0[i];
            const block_q8_1 * GGML_RESTRICT b_y1 = &vy1[i];

            float32_t summs_t[4] = {
                GGML_FP16_TO_FP32(b_x0->m) * GGML_FP16_TO_FP32(b_y0->s),
                GGML_FP16_TO_FP32(b_x1->m) * GGML_FP16_TO_FP32(b_y0->s),
                GGML_FP16_TO_FP32(b_x0->m) * GGML_FP16_TO_FP32(b_y1->s),
                GGML_FP16_TO_FP32(b_x1->m) * GGML_FP16_TO_FP32(b_y1->s)
            };
            summs0 = vaddq_f32(summs0, vld1q_f32(summs_t));

            const uint8x16_t m4b = vdupq_n_u8(0x0F);

            const uint8x16_t v0_0 = vld1q_u8(b_x0->qs);
            const uint8x16_t v0_1 = vld1q_u8(b_x1->qs);

            // 4-bit -> 8-bit
            const int8x16_t x0_l = vreinterpretq_s8_u8(vandq_u8  (v0_0, m4b));
            const int8x16_t x0_h = vreinterpretq_s8_u8(vshrq_n_u8(v0_0, 4));
            const int8x16_t x1_l = vreinterpretq_s8_u8(vandq_u8  (v0_1, m4b));
            const int8x16_t x1_h = vreinterpretq_s8_u8(vshrq_n_u8(v0_1, 4));

            // load y
            const int8x16_t y0_l = vld1q_s8(b_y0->qs);
            const int8x16_t y0_h = vld1q_s8(b_y0->qs + 16);
            const int8x16_t y1_l = vld1q_s8(b_y1->qs);
            const int8x16_t y1_h = vld1q_s8(b_y1->qs + 16);

            // mmla into int32x4_t
            float32_t _scale[4] = {
                GGML_FP16_TO_FP32(b_x0->d)*GGML_FP16_TO_FP32(b_y0->d),
                GGML_FP16_TO_FP32(b_x0->d)*GGML_FP16_TO_FP32(b_y1->d),
                GGML_FP16_TO_FP32(b_x1->d)*GGML_FP16_TO_FP32(b_y0->d),
                GGML_FP16_TO_FP32(b_x1->d)*GGML_FP16_TO_FP32(b_y1->d)
            };
            float32x4_t scale = vld1q_f32(_scale);

            int8x16_t l0 = vreinterpretq_s8_s64(vzip1q_s64(vreinterpretq_s64_s8(x0_l), vreinterpretq_s64_s8(x1_l)));
            int8x16_t l1 = vreinterpretq_s8_s64(vzip2q_s64(vreinterpretq_s64_s8(x0_l), vreinterpretq_s64_s8(x1_l)));

            int8x16_t l2 = vreinterpretq_s8_s64(vzip1q_s64(vreinterpretq_s64_s8(x0_h), vreinterpretq_s64_s8(x1_h)));
            int8x16_t l3 = vreinterpretq_s8_s64(vzip2q_s64(vreinterpretq_s64_s8(x0_h), vreinterpretq_s64_s8(x1_h)));

            int8x16_t r0 = vreinterpretq_s8_s64(vzip1q_s64(vreinterpretq_s64_s8(y0_l), vreinterpretq_s64_s8(y1_l)));
            int8x16_t r1 = vreinterpretq_s8_s64(vzip2q_s64(vreinterpretq_s64_s8(y0_l), vreinterpretq_s64_s8(y1_l)));

            int8x16_t r2 = vreinterpretq_s8_s64(vzip1q_s64(vreinterpretq_s64_s8(y0_h), vreinterpretq_s64_s8(y1_h)));
            int8x16_t r3 = vreinterpretq_s8_s64(vzip2q_s64(vreinterpretq_s64_s8(y0_h), vreinterpretq_s64_s8(y1_h)));
            sumv0 = vmlaq_f32(sumv0,(vcvtq_f32_s32(vmmlaq_s32((vmmlaq_s32((vmmlaq_s32((vmmlaq_s32(vdupq_n_s32(0), l0, r0)),
                                                l1, r1)), l2, r2)), l3, r3))), scale);
        }

        float32x4_t sumv1 = vextq_f32 (sumv0, sumv0, 2);
        float32x4_t sumv2 = vzip1q_f32(sumv0, sumv1);

        sumv2 = vaddq_f32(sumv2, summs0);

        vst1_f32(s,      vget_low_f32 (sumv2));
        vst1_f32(s + bs, vget_high_f32(sumv2));

        return;
    }
#endif

    int ib = 0;
    float sumf = 0;

    // TODO: add WASM SIMD
#if defined(__ARM_NEON)
    float32x4_t sumv0 = vdupq_n_f32(0.0f);
    float32x4_t sumv1 = vdupq_n_f32(0.0f);

    float summs = 0;

    for (; ib + 1 < nb; ib += 2) {
        const block_q4_1 * GGML_RESTRICT x0 = &x[ib + 0];
        const block_q4_1 * GGML_RESTRICT x1 = &x[ib + 1];
        const block_q8_1 * GGML_RESTRICT y0 = &y[ib + 0];
        const block_q8_1 * GGML_RESTRICT y1 = &y[ib + 1];

        summs += GGML_FP16_TO_FP32(x0->m) * GGML_FP16_TO_FP32(y0->s) + GGML_FP16_TO_FP32(x1->m) * GGML_FP16_TO_FP32(y1->s);

        const uint8x16_t m4b = vdupq_n_u8(0x0F);

        const uint8x16_t v0_0 = vld1q_u8(x0->qs);
        const uint8x16_t v0_1 = vld1q_u8(x1->qs);

        // 4-bit -> 8-bit
        const int8x16_t v0_0l = vreinterpretq_s8_u8(vandq_u8  (v0_0, m4b));
        const int8x16_t v0_0h = vreinterpretq_s8_u8(vshrq_n_u8(v0_0, 4));
        const int8x16_t v0_1l = vreinterpretq_s8_u8(vandq_u8  (v0_1, m4b));
        const int8x16_t v0_1h = vreinterpretq_s8_u8(vshrq_n_u8(v0_1, 4));

        // load y
        const int8x16_t v1_0l = vld1q_s8(y0->qs);
        const int8x16_t v1_0h = vld1q_s8(y0->qs + 16);
        const int8x16_t v1_1l = vld1q_s8(y1->qs);
        const int8x16_t v1_1h = vld1q_s8(y1->qs + 16);

        // dot product into int32x4_t
        const int32x4_t p_0 = ggml_vdotq_s32(ggml_vdotq_s32(vdupq_n_s32(0), v0_0l, v1_0l), v0_0h, v1_0h);
        const int32x4_t p_1 = ggml_vdotq_s32(ggml_vdotq_s32(vdupq_n_s32(0), v0_1l, v1_1l), v0_1h, v1_1h);

        sumv0 = vmlaq_n_f32(sumv0, vcvtq_f32_s32(p_0), GGML_FP16_TO_FP32(x0->d)*GGML_FP16_TO_FP32(y0->d));
        sumv1 = vmlaq_n_f32(sumv1, vcvtq_f32_s32(p_1), GGML_FP16_TO_FP32(x1->d)*GGML_FP16_TO_FP32(y1->d));
    }

    sumf = vaddvq_f32(sumv0) + vaddvq_f32(sumv1) + summs;
#elif defined(__AVX2__) || defined(__AVX__)
    // Initialize accumulator with zeros
    __m256 acc = _mm256_setzero_ps();

    float summs = 0;

    // Main loop
    for (; ib < nb; ++ib) {
        const float d0 = GGML_FP16_TO_FP32(x[ib].d);
        const float d1 = GGML_FP16_TO_FP32(y[ib].d);

        summs += GGML_FP16_TO_FP32(x[ib].m) * GGML_FP16_TO_FP32(y[ib].s);

        const __m256 d0v = _mm256_set1_ps( d0 );
        const __m256 d1v = _mm256_set1_ps( d1 );

        // Compute combined scales
        const __m256 d0d1 = _mm256_mul_ps( d0v, d1v );

        // Load 16 bytes, and unpack 4 bit fields into bytes, making 32 bytes
        const __m256i qx = bytes_from_nibbles_32(x[ib].qs);
        const __m256i qy = _mm256_loadu_si256( (const __m256i *)y[ib].qs );

        const __m256 xy = mul_sum_us8_pairs_float(qx, qy);

        // Accumulate d0*d1*x*y
#if defined(__AVX2__)
        acc = _mm256_fmadd_ps( d0d1, xy, acc );
#else
        acc = _mm256_add_ps( _mm256_mul_ps( d0d1, xy ), acc );
#endif
    }

    sumf = hsum_float_8(acc) + summs;
#elif defined(__riscv_v_intrinsic)
    size_t vl = qk / 2;

    for (; ib < nb; ++ib) {
        // load elements
        vuint8m1_t tx = __riscv_vle8_v_u8m1(x[ib].qs, vl);

        vint8m1_t y0 = __riscv_vle8_v_i8m1(y[ib].qs, vl);
        vint8m1_t y1 = __riscv_vle8_v_i8m1(y[ib].qs+16, vl);

        // mask and store lower part of x, and then upper part
        vuint8m1_t x_a = __riscv_vand_vx_u8m1(tx, 0x0F, vl);
        vuint8m1_t x_l = __riscv_vsrl_vx_u8m1(tx, 0x04, vl);

        vint8m1_t v0 = __riscv_vreinterpret_v_u8m1_i8m1(x_a);
        vint8m1_t v1 = __riscv_vreinterpret_v_u8m1_i8m1(x_l);

        vint16m2_t vec_mul1 = __riscv_vwmul_vv_i16m2(v0, y0, vl);
        vint16m2_t vec_mul2 = __riscv_vwmacc_vv_i16m2(vec_mul1, v1, y1, vl);

        vint32m1_t vec_zero = __riscv_vmv_v_x_i32m1(0, vl);
        vint32m1_t vs2 = __riscv_vwredsum_vs_i16m2_i32m1(vec_mul2, vec_zero, vl);

        int sumi = __riscv_vmv_x_s_i32m1_i32(vs2);

        sumf += (GGML_FP16_TO_FP32(x[ib].d)*GGML_FP16_TO_FP32(y[ib].d))*sumi + GGML_FP16_TO_FP32(x[ib].m)*GGML_FP16_TO_FP32(y[ib].s);
    }

#elif defined(__POWER9_VECTOR__)
    const vector signed char lowMask = vec_splats((signed char)0xF);
    const vector signed int v0 = vec_splats((int32_t)0);
    const vector unsigned char v4 = vec_splats((unsigned char)0x4);

    vector float vsumf0 = vec_splats(0.0f);

#pragma GCC unroll 4
    for (; ib < nb; ++ib) {
        __builtin_prefetch(x[ib].qs, 0, 1);
        __builtin_prefetch(y[ib].qs, 0, 1);

        vector float vxd = vec_splats(GGML_FP16_TO_FP32(x[ib].d));
        vector float vyd = vec_splats(GGML_FP16_TO_FP32(y[ib].d));
        vector float vd = vec_mul(vxd, vyd);

        vector float vxmin = vec_splats(GGML_FP16_TO_FP32(x[ib].m));
        vector float vys = {GGML_FP16_TO_FP32(y[ib].s), 0.0f, 0.0f, 0.0f};
        vsumf0 = vec_madd(vxmin, vys, vsumf0);

        vector signed char qxs = (vector signed char)vec_xl( 0, x[ib].qs);
        vector signed char q8y0 = vec_xl( 0, y[ib].qs);
        vector signed char q8y1 = vec_xl(16, y[ib].qs);

        vector unsigned char q4x0 = (vector unsigned char)vec_and(qxs, lowMask);
        vector unsigned char q4x1 = (vector unsigned char)vec_sr(qxs, v4);

        vector signed int vsumi0 = v0;

        vsumi0 = vec_msum(q8y0, q4x0, vsumi0);
        vsumi0 = vec_msum(q8y1, q4x1, vsumi0);

        vsumf0 = vec_madd(vec_ctf(vsumi0, 0), vd, vsumf0);
    }

    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 4));
    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 8));

    sumf = vec_extract(vsumf0, 0);

#elif defined(__loongarch_asx)
    // Initialize accumulator with zeros
    __m256 acc = (__m256)__lasx_xvldi(0);

    float summs = 0;

    // Main loop
    for (; ib < nb; ++ib) {
        const float d0 = GGML_FP16_TO_FP32(x[ib].d);
        const float d1 = GGML_FP16_TO_FP32(y[ib].d);

        summs += GGML_FP16_TO_FP32(x[ib].m) * GGML_FP16_TO_FP32(y[ib].s);

        const __m256 d0v = __lasx_xvreplfr2vr_s( d0 );
        const __m256 d1v = __lasx_xvreplfr2vr_s( d1 );

        // Compute combined scales
        const __m256 d0d1 = __lasx_xvfmul_s( d0v, d1v );

        // Load 16 bytes, and unpack 4 bit fields into bytes, making 32 bytes
        const __m256i qx = bytes_from_nibbles_32(x[ib].qs);
        const __m256i qy = __lasx_xvld( (const __m256i *)y[ib].qs, 0);

        const __m256 xy = mul_sum_us8_pairs_float(qx, qy);

        // Accumulate d0*d1*x*y
        acc = __lasx_xvfmadd_s( d0d1, xy, acc );
    }

    sumf = hsum_float_8(acc) + summs;
#elif defined(__VXE__) || defined(__VXE2__)
    float summs = 0;
    float32x4_t acc = vec_splats(0.0f);

    const uint8x16_t v_m = vec_splat_u8(0x0F);

#pragma GCC unroll 4
    for (; ib < nb; ++ib) {
        __builtin_prefetch(x[ib].qs, 0, 1);
        __builtin_prefetch(y[ib].qs, 0, 1);

        summs += GGML_FP16_TO_FP32(x[ib].m) * GGML_FP16_TO_FP32(y[ib].s);

        const uint8x16_t v_x = vec_xl(0, x[ib].qs);
        const int8x16_t v_xl = (const int8x16_t)(v_x & v_m);
        const int8x16_t v_xh = (const int8x16_t)(v_x >> 4);

        const int8x16_t v_yl = vec_xl(0      , y[ib].qs);
        const int8x16_t v_yh = vec_xl(QK8_1/2, y[ib].qs);

        const int32x4_t v_xy_ = ggml_vec_dot(ggml_vec_dot(vec_splats(0), v_xl, v_yl), v_xh, v_yh);
        const float32x4_t v_xy = vec_float(v_xy_);

        const float32x4_t v_d = vec_splats(GGML_FP16_TO_FP32(x[ib].d) * GGML_FP16_TO_FP32(y[ib].d));

        acc = vec_madd(v_xy, v_d, acc);
    }

    sumf = acc[0] + acc[1] + acc[2] + acc[3] + summs;
#endif
    for (; ib < nb; ++ib) {
        int sumi0 = 0;
        int sumi1 = 0;

        for (int j = 0; j < qk/2; ++j) {
            const int v0 = (x[ib].qs[j] & 0x0F);
            const int v1 = (x[ib].qs[j] >>   4);

            sumi0 += (v0 * y[ib].qs[j]);
            sumi1 += (v1 * y[ib].qs[j + qk/2]);
        }

        int sumi = sumi0 + sumi1;
        sumf += (GGML_FP16_TO_FP32(x[ib].d)*GGML_FP16_TO_FP32(y[ib].d))*sumi + GGML_FP16_TO_FP32(x[ib].m)*GGML_FP16_TO_FP32(y[ib].s);
    }

    *s = sumf;
}